

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::HashAggregateDistinctFinalizeEvent::FinishEvent(HashAggregateDistinctFinalizeEvent *this)

{
  shared_ptr<duckdb::HashAggregateFinalizeEvent,_true> new_event;
  shared_ptr<duckdb::Event,_true> local_48;
  undefined1 local_38 [32];
  
  local_38._24_8_ =
       (this->super_BasePipelineEvent).pipeline.internal.
       super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_shared_ptr<duckdb::HashAggregateFinalizeEvent,duckdb::ClientContext&,duckdb::Pipeline*,duckdb::PhysicalHashAggregate_const&,duckdb::HashAggregateGlobalSinkState&>
            ((ClientContext *)local_38,(Pipeline **)this->context,
             (PhysicalHashAggregate *)(local_38 + 0x18),(HashAggregateGlobalSinkState *)this->op);
  local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38._0_8_;
  local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
  local_38._0_8_ = (element_type *)0x0;
  local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent((Event *)this,&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

void HashAggregateDistinctFinalizeEvent::FinishEvent() {
	// Now that everything is added to the main ht, we can actually finalize
	auto new_event = make_shared_ptr<HashAggregateFinalizeEvent>(context, pipeline.get(), op, gstate);
	this->InsertEvent(std::move(new_event));
}